

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

int __thiscall
QtMWidgets::AbstractScrollAreaPrivate::init(AbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QColor *pQVar2;
  QWidget *pQVar3;
  ScrollIndicator *pSVar4;
  BlurEffect *pBVar5;
  QVariantAnimation *pQVar6;
  QTimer *pQVar7;
  Scroller *this_00;
  QLatin1String latin1;
  QColor ic;
  QArrayDataPointer<char16_t> local_68;
  QStyleOption opt;
  QPalette local_28 [24];
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  pQVar2 = QPalette::color(local_28,Highlight);
  ic._0_8_ = *(undefined8 *)pQVar2;
  ic._8_8_ = *(undefined8 *)((long)&pQVar2->ct + 4);
  pQVar3 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar3,this->q,0);
  this->viewport = pQVar3;
  latin1.m_data = "qt_scrollarea_viewport";
  latin1.m_size = 0x16;
  QString::QString((QString *)&local_68,latin1);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QWidget::setBackgroundRole((ColorRole)this->viewport);
  QWidget::setAutoFillBackground(SUB81(this->viewport,0));
  QWidget::setFocusProxy(this->viewport);
  QWidget::setContentsMargins((int)this->viewport,0,0,0);
  pSVar4 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar4,&ic,Horizontal,this->viewport);
  this->horIndicator = pSVar4;
  pSVar4 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar4,&ic,Vertical,this->viewport);
  this->vertIndicator = pSVar4;
  pBVar5 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar5,&ic,Vertical,this->viewport);
  this->horBlur = pBVar5;
  pBVar5 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar5,&ic,Horizontal,this->viewport);
  this->vertBlur = pBVar5;
  pQVar6 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar6,(QObject *)this->q);
  this->horBlurAnim = pQVar6;
  QVariantAnimation::setDuration((int)pQVar6);
  QAbstractAnimation::setLoopCount((int)this->horBlurAnim);
  pQVar6 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar6,(QObject *)this->q);
  this->vertBlurAnim = pQVar6;
  QVariantAnimation::setDuration((int)pQVar6);
  QAbstractAnimation::setLoopCount((int)this->vertBlurAnim);
  pQVar7 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar7,(QObject *)this->q);
  this->animationTimer = pQVar7;
  QTimer::setSingleShot(SUB81(pQVar7,0));
  pQVar7 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar7,(QObject *)this->q);
  this->startBlurAnimTimer = pQVar7;
  QTimer::setSingleShot(SUB81(pQVar7,0));
  this_00 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_00,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_00;
  QWidget::setFocusPolicy((FocusPolicy)this->q);
  QFrame::setFrameStyle((int)this->q);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  layoutChildren(this,&opt);
  iVar1 = QStyleOption::~QStyleOption(&opt);
  return iVar1;
}

Assistant:

void
AbstractScrollAreaPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	const QColor ic = opt.palette.color( QPalette::Highlight );

	viewport = new QWidget( q );
	viewport->setObjectName( QLatin1String( "qt_scrollarea_viewport" ) );
	viewport->setBackgroundRole( QPalette::Base );
	viewport->setAutoFillBackground( true );
	viewport->setFocusProxy( q );
	viewport->setContentsMargins( 0, 0, 0, 0 );

	horIndicator = new ScrollIndicator( ic, Qt::Horizontal, viewport );
	vertIndicator = new ScrollIndicator( ic, Qt::Vertical, viewport );

	horBlur = new BlurEffect( ic, Qt::Vertical, viewport );
	vertBlur = new BlurEffect( ic, Qt::Horizontal, viewport );

	horBlurAnim = new QVariantAnimation( q );
	horBlurAnim->setDuration( 300 );
	horBlurAnim->setLoopCount( 1 );

	vertBlurAnim = new QVariantAnimation( q );
	vertBlurAnim->setDuration( 300 );
	vertBlurAnim->setLoopCount( 1 );

	animationTimer = new QTimer( q );
	animationTimer->setSingleShot( true );

	startBlurAnimTimer = new QTimer( q );
	startBlurAnimTimer->setSingleShot( true );

	scroller = new Scroller( q, q );

	q->setFocusPolicy( Qt::WheelFocus );
	q->setFrameStyle( QFrame::NoFrame | QFrame::Plain );
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Expanding );

	layoutChildren( opt );
}